

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

void do_pop_up_string_proc(Am_Object param_1)

{
  Am_Value_List *pAVar1;
  ostream *poVar2;
  Am_Value v;
  Am_String local_40;
  Am_Value_List local_38 [16];
  Am_Value local_28;
  Am_Value_List local_18 [16];
  
  Am_Value_List::Am_Value_List(local_18);
  pAVar1 = (Am_Value_List *)Am_Value_List::Add(local_18,"First line of message",1,1);
  Am_Value_List::Am_Value_List(local_38,pAVar1);
  Am_String::Am_String(&local_40,"Initial value",true);
  Am_Get_Input_From_Dialog(&local_28,local_38,&local_40,0xffffd8f0,0xffffd8f0,1);
  Am_String::~Am_String(&local_40);
  Am_Value_List::~Am_Value_List(local_38);
  Am_Value_List::~Am_Value_List(local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Value returned is `",0x13);
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
  std::ostream::flush();
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_string, (Am_Object /*cmd*/))
{
  Am_Value v = Am_Get_Input_From_Dialog(
      Am_Value_List().Add("First line of message"), "Initial value");
  std::cout << "Value returned is `" << v << "'\n" << std::flush;
}